

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skynet_handle.c
# Opt level: O1

uint32_t skynet_handle_findname(char *name)

{
  int *piVar1;
  handle_name *phVar2;
  handle_storage *phVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  uint32_t local_3c;
  
  phVar3 = H;
  while( true ) {
    do {
    } while ((phVar3->lock).write != 0);
    LOCK();
    piVar1 = &(phVar3->lock).read;
    *piVar1 = *piVar1 + 1;
    UNLOCK();
    if ((phVar3->lock).write == 0) break;
    LOCK();
    piVar1 = &(phVar3->lock).read;
    *piVar1 = *piVar1 + -1;
    UNLOCK();
  }
  iVar7 = phVar3->name_count + -1;
  iVar6 = 0;
  local_3c = 0;
  do {
    if (iVar7 < iVar6) break;
    uVar5 = (uint)(iVar6 + iVar7) >> 1;
    phVar2 = phVar3->name;
    iVar4 = strcmp(phVar2[uVar5].name,name);
    if (iVar4 == 0) {
      local_3c = phVar2[uVar5].handle;
    }
    else if (iVar4 < 0) {
      iVar6 = uVar5 + 1;
    }
    else {
      iVar7 = uVar5 - 1;
    }
  } while (iVar4 != 0);
  LOCK();
  piVar1 = &(phVar3->lock).read;
  *piVar1 = *piVar1 + -1;
  UNLOCK();
  return local_3c;
}

Assistant:

uint32_t 
skynet_handle_findname(const char * name) {
	struct handle_storage *s = H;

	rwlock_rlock(&s->lock);

	uint32_t handle = 0;

	int begin = 0;
	int end = s->name_count - 1;
	while (begin<=end) {
		int mid = (begin+end)/2;
		struct handle_name *n = &s->name[mid];
		int c = strcmp(n->name, name);
		if (c==0) {
			handle = n->handle;
			break;
		}
		if (c<0) {
			begin = mid + 1;
		} else {
			end = mid - 1;
		}
	}

	rwlock_runlock(&s->lock);

	return handle;
}